

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snprintf_support.c
# Opt level: O2

uint parse_format(char *format,char *pformatList,uint maxFormats)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  
  uVar11 = 0;
  uVar4 = 0;
LAB_0010fe05:
  do {
    uVar12 = uVar4;
    uVar7 = (uint)uVar12;
    if (((0xfff < uVar7) || (format[uVar12] == '\0')) || (maxFormats <= uVar11)) {
      return uVar11;
    }
    if (format[uVar12] != '%') goto LAB_0010ff85;
    uVar5 = (ulong)(byte)format[uVar12 + 1];
    uVar8 = uVar12 + 1;
    if (0x30 < uVar5) break;
    if ((0x1280900000000U >> (uVar5 & 0x3f) & 1) != 0) {
      uVar8 = (ulong)(uVar7 + 2);
      break;
    }
    uVar4 = uVar8 & 0xffffffff;
  } while ((0x2000000001U >> (uVar5 & 0x3f) & 1) != 0);
  uVar6 = (uint)uVar8;
  do {
    uVar6 = uVar6 + 1;
    uVar7 = (uint)uVar8;
    cVar1 = format[uVar8 & 0xffffffff];
    uVar8 = (ulong)(uVar7 + 1);
  } while ((byte)(cVar1 - 0x30U) < 10);
  if (cVar1 == '.') {
    do {
      uVar7 = uVar6;
      cVar1 = format[uVar7];
      uVar6 = uVar7 + 1;
    } while ((byte)(cVar1 - 0x30U) < 10);
  }
  if (cVar1 == 'L') {
    bVar10 = 1;
    bVar3 = false;
    bVar13 = false;
    bVar9 = 0;
  }
  else {
    if ((cVar1 == 'z') || (cVar1 == 'j')) {
LAB_0010feca:
      uVar7 = uVar7 + 1;
LAB_0010fecc:
      bVar3 = false;
LAB_0010fece:
      bVar13 = false;
LAB_0010fed0:
      bVar9 = 0;
    }
    else {
      if (cVar1 == 'l') {
        uVar6 = uVar7 + 1;
        bVar13 = format[uVar6] != 'l';
        uVar7 = uVar7 + 2;
        if (bVar13) {
          uVar7 = uVar6;
        }
        bVar3 = false;
        goto LAB_0010fed0;
      }
      if (cVar1 == 't') goto LAB_0010feca;
      if (cVar1 != 'h') goto LAB_0010fecc;
      if (format[uVar7 + 1] == 'h') {
        uVar7 = uVar7 + 2;
        bVar3 = true;
        goto LAB_0010fece;
      }
      bVar9 = 1;
      bVar3 = false;
      bVar13 = false;
      uVar7 = uVar7 + 1;
    }
    bVar10 = 0;
  }
  bVar2 = format[uVar7];
  switch(bVar2) {
  case 0x58:
  case 100:
  case 0x69:
  case 0x6f:
  case 0x75:
  case 0x78:
    bVar9 = bVar9 * '\x04' + 100;
    if (bVar13 != false) {
      bVar9 = 0x6c;
    }
    bVar10 = 99;
    goto LAB_0010ff57;
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    goto switchD_0010fef8_caseD_59;
  case 0x61:
  case 0x65:
  case 0x66:
  case 0x67:
switchD_0010fef8_caseD_61:
    pformatList[uVar11] = (bVar10 ^ 1) << 5 | 0x47;
    break;
  case 99:
    pformatList[uVar11] = (bVar13 ^ 1U) << 5 | 0x43;
    break;
  case 0x6d:
    uVar4 = (ulong)(uVar7 + 1);
    goto LAB_0010fe05;
  case 0x6e:
    bVar9 = bVar9 ^ 0x33;
    if (bVar13 != false) {
      bVar9 = 0x34;
    }
    bVar10 = 0x31;
LAB_0010ff57:
    if (bVar3) {
      bVar9 = bVar10;
    }
    pformatList[uVar11] = bVar9;
    break;
  case 0x70:
    pformatList[uVar11] = 'p';
    break;
  case 0x73:
    bVar9 = (bVar10 ^ 1) << 5 | 0x53;
    if (bVar13 != false) {
      bVar9 = 0x53;
    }
    pformatList[uVar11] = bVar9;
    break;
  default:
    if ((bVar2 - 0x45 < 3) || (bVar2 == 0x41)) goto switchD_0010fef8_caseD_61;
    goto switchD_0010fef8_caseD_59;
  }
  uVar11 = uVar11 + 1;
  uVar7 = uVar7 + 1;
LAB_0010ff85:
  uVar4 = (ulong)((format[uVar7] != '%') + uVar7);
  goto LAB_0010fe05;
switchD_0010fef8_caseD_59:
  __printf_chk(1,"failed to recognize format string [");
  for (; uVar12 < uVar7; uVar12 = uVar12 + 1) {
    __printf_chk(1,"%c",(int)format[uVar12]);
  }
  puts("]");
  goto LAB_0010ff85;
}

Assistant:

unsigned int
parse_format(const char *format, char pformatList[], unsigned int maxFormats)
{
	unsigned int  numFormats = 0;
	unsigned int  index = 0;
	unsigned int  start = 0;
	char		  lmod = 0;

	while (index < RSIZE_MAX_STR && format[index] != '\0' && numFormats < maxFormats)
	{
		if (format[index] == '%') {
			start = index; // remember where the format string started
			// Check for flags
			switch( format[++index]) {
			case '\0': continue; // skip - end of format string
			case '%' : continue; // skip - actually a percent character
			case '#' : // convert to alternate form
			case '0' : // zero pad
			case '-' : // left adjust
			case ' ' : // pad with spaces
			case '+' : // force a sign be used
				index++; // skip the flag character
				break;
			}
			// check for and skip the optional field width
			while ( format[index] != '\0' && format[index] >= '0' && format[index] <= '9') {
				index++;
			}
			// Check for an skip the optional precision
			if ( format[index] != '\0' && format[index] == '.') {
				index++; // skip the period
				while ( format[index] != '\0' && format[index] >= '0' && format[index] <= '9') {
					index++;
				}
			}
			// Check for and skip the optional length modifiers
			lmod = ' ';
			switch( format[index]) {
			case 'h' : if ( format[++index] == 'h') {
				           ++index; //also recognize the 'hh' modifier
				           lmod = 'H'; // for char
			           } else {
			               lmod = 'h'; // for short
			           }
					   break;
			case 'l' : if ( format[++index] == 'l') {
				           ++index; //also recognize the 'll' modifier
				           lmod = 'd'; // for long long
			           } else {
			               lmod = 'l'; // for long
			           }
			           break;
			case 'L' : lmod = 'L'; break;
			case 'j' :
			case 'z' :
			case 't' : index++;
			           break;
			}

			// Recognize and record the actual modifier
			switch( format[index]) {
			case 'c' :
				 if ( lmod == 'l') {
					 pformatList[numFormats] = FMT_WCHAR; // store the format character
				 } else {
					 pformatList[numFormats] = FMT_CHAR;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'd' : case 'i' : // signed
			case 'o' : case 'u' : // unsigned
			case 'x' : case 'X' : // unsigned
				 if ( lmod == 'H') {
					 pformatList[numFormats] = FMT_CHAR; // store the format character
				 } else if ( lmod == 'l') {
				 	 pformatList[numFormats] = FMT_LONG; // store the format character
				 } else if ( lmod == 'h') {
					 pformatList[numFormats] = FMT_SHORT; // store the format character
				 } else{
					 pformatList[numFormats] = FMT_INT;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'e' : case 'E' :
			case 'f' : case 'F' :
			case 'g' : case 'G' :
			case 'a' : case 'A' :
				 if ( lmod == 'L') {
					 pformatList[numFormats] = FMT_LDOUBLE; // store the format character
				 } else{
					 pformatList[numFormats] = FMT_DOUBLE;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 's' :
				 if ( lmod == 'l' || lmod == 'L') {
					 pformatList[numFormats] = FMT_WSTRING; // store the format character
				 } else {
					 pformatList[numFormats] = FMT_STRING;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'p' :
				 pformatList[numFormats] = FMT_VOID;
				 numFormats++;
				 index++; // skip the format character
				 break;

			case 'n' :
				 if ( lmod == 'H') {
					 pformatList[numFormats] = FMT_PCHAR; // store the format character
				 } else if ( lmod == 'l') {
					 pformatList[numFormats] = FMT_PLONG; // store the format character
				 } else if ( lmod == 'h') {
					 pformatList[numFormats] = FMT_PSHORT; // store the format character
				 } else{
					 pformatList[numFormats] = FMT_PINT;
				 }
				 numFormats++;
				 index++; // skip the format character
				 break;
			case 'm' :
			     // Does not represent an argument in the call stack
			     index++; // skip the format character
			     continue;
			default:
				printf("failed to recognize format string [");
				for (;start<index; start++) { printf("%c", format[start]); }
				puts("]");
				break;
			}
		}
        if (format[index] != '%')
            // don't know why it skips over blindly, not handling cases such as "%s%d".
            index++; // move past this character
	}

	return numFormats;
}